

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O1

Carver * __thiscall
carver::Carver::removeSeams
          (Carver *this,Mat *source,vector<int,_std::allocator<int>_> *verticalSeam,
          vector<int,_std::allocator<int>_> *horizontalSeam)

{
  Mat *in_R8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  
  cv::Mat::Mat(&this->originalImage_,(Mat *)verticalSeam);
  std::vector<int,_std::allocator<int>_>::vector(&local_98,horizontalSeam);
  removeVerticalSeam((Carver *)&stack0xffffffffffffff80,(Mat *)horizontalSeam,verticalSeam);
  cv::Mat::operator=(&this->originalImage_,(Mat *)&stack0xffffffffffffff80);
  cv::Mat::~Mat((Mat *)&stack0xffffffffffffff80);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,(vector<int,_std::allocator<int>_> *)in_R8);
  removeHorizontalSeam
            ((Carver *)&stack0xffffffffffffff80,in_R8,(vector<int,_std::allocator<int>_> *)this);
  cv::Mat::operator=(&this->originalImage_,(Mat *)&stack0xffffffffffffff80);
  cv::Mat::~Mat((Mat *)&stack0xffffffffffffff80);
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

cv::Mat Carver::removeSeams(cv::Mat &source, vector<int> verticalSeam,
                            vector<int> horizontalSeam) {
    cv::Mat target = source;
    target = removeVerticalSeam(source, verticalSeam);
    target = removeHorizontalSeam(target, horizontalSeam);
    return target;
}